

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O0

SmallBuffer * helics::typeConvert(DataType type,double *vals,size_t size)

{
  initializer_list_t init;
  string_view valname;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *this;
  SmallBuffer *this_00;
  reference other;
  ulong in_RCX;
  double *in_RDX;
  uint in_ESI;
  SmallBuffer *in_RDI;
  double dVar1;
  size_t ii_1;
  json jsonArray;
  json json;
  size_t ii;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> cvec;
  complex<double> cval;
  double *in_stack_fffffffffffffde8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffffdf8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe00;
  NamedPoint *in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u;
  NamedPoint *in_stack_fffffffffffffe10;
  double *in_stack_fffffffffffffe18;
  char *in_stack_fffffffffffffe20;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *this_02;
  char *in_stack_fffffffffffffe38;
  SmallBuffer *this_03;
  DataType in_stack_fffffffffffffe6c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  ulong local_168;
  initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  local_160 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  undefined8 local_120;
  ulong local_118;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_110 [2];
  __sv_type local_d8;
  double in_stack_ffffffffffffff50;
  DataType in_stack_ffffffffffffff5c;
  DataType in_stack_ffffffffffffffa8;
  DataType in_stack_ffffffffffffffac;
  complex<double> local_50;
  long local_40;
  TimeRepresentation<count_time<9,_long>_> local_38;
  baseType local_30;
  double local_28;
  ulong local_20;
  
  if ((in_RDX == (double *)0x0) || (in_RCX == 0)) {
    emptyBlock(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
  }
  else if (in_RCX == 1) {
    typeConvert(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff50);
  }
  else {
    this = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            *)(ulong)in_ESI;
    local_20 = in_RCX;
    switch(this) {
    case (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          *)0x0:
    case (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          *)0x9:
      helicsVectorString_abi_cxx11_((double *)in_RDI,(size_t)in_RDI);
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffdf0);
      ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe08);
      std::__cxx11::string::~string(in_stack_fffffffffffffdf0);
      break;
    case (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          *)0x1:
      local_28 = vectorNorm((double *)in_stack_fffffffffffffdf0,(size_t)in_stack_fffffffffffffde8);
      ValueConverter<double>::convert((double *)in_stack_fffffffffffffe08);
      break;
    case (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          *)0x2:
      dVar1 = vectorNorm((double *)in_stack_fffffffffffffdf0,(size_t)in_stack_fffffffffffffde8);
      local_40 = (long)dVar1;
      ValueConverter<long>::convert((long *)in_stack_fffffffffffffe08);
      break;
    case (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          *)0x3:
      std::complex<double>::complex(&local_50,*in_RDX,in_RDX[1]);
      ValueConverter<std::complex<double>_>::convert((complex<double> *)in_stack_fffffffffffffe08);
      break;
    case (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          *)0x4:
    default:
      ValueConverter<double>::convert(in_stack_fffffffffffffe18,(size_t)in_stack_fffffffffffffe10);
      break;
    case (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          *)0x5:
      this_02 = local_110;
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
                ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)0x32cd49);
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::reserve
                (this_02,(size_type)in_stack_fffffffffffffe18);
      for (local_118 = 0; local_118 < local_20; local_118 = local_118 + 1) {
        local_120 = 0;
        std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
        emplace_back<double_const&,double>
                  ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                   in_stack_fffffffffffffe00,(double *)in_stack_fffffffffffffdf8,
                   (double *)in_stack_fffffffffffffdf0);
      }
      ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
      convert((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
              in_stack_fffffffffffffe08);
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
                ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                 in_stack_fffffffffffffe00);
      break;
    case (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          *)0x6:
      helicsVectorString_abi_cxx11_((double *)in_RDI,(size_t)in_RDI);
      local_d8 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffdf0)
      ;
      nan("0");
      valname._M_str = in_stack_fffffffffffffe20;
      valname._M_len = (size_t)in_stack_fffffffffffffe18;
      NamedPoint::NamedPoint(in_stack_fffffffffffffe10,valname,(double)in_stack_fffffffffffffe08);
      ValueConverter<helics::NamedPoint>::convert(in_stack_fffffffffffffe08);
      NamedPoint::~NamedPoint((NamedPoint *)0x32ccdc);
      std::__cxx11::string::~string(in_stack_fffffffffffffdf0);
      break;
    case (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          *)0x7:
      vectorNorm((double *)in_stack_fffffffffffffdf0,(size_t)in_stack_fffffffffffffde8);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8);
      ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe08);
      break;
    case (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          *)0x8:
      vectorNorm((double *)in_stack_fffffffffffffdf0,(size_t)in_stack_fffffffffffffde8);
      TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
                ((TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffffdf0,
                 (double)in_stack_fffffffffffffde8);
      local_30 = TimeRepresentation<count_time<9,_long>_>::getBaseTimeCode(&local_38);
      ValueConverter<long>::convert((long *)in_stack_fffffffffffffe08);
      break;
    case (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          *)0x1e:
      this_03 = in_RDI;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      typeNameStringRef_abi_cxx11_(in_stack_fffffffffffffe6c);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)in_stack_fffffffffffffe10,&in_stack_fffffffffffffe08->name);
      this_00 = (SmallBuffer *)
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>(this,in_stack_fffffffffffffe38);
      u = &local_140;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)in_stack_fffffffffffffdf0);
      std::
      initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
      ::initializer_list(local_160);
      init._M_len = (size_type)u;
      init._M_array = (iterator)in_stack_fffffffffffffe00;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::array(init);
      for (local_168 = 0; local_168 < local_20; local_168 = local_168 + 1) {
        in_stack_fffffffffffffe00 =
             (basic_string_view<char,_std::char_traits<char>_> *)&local_188.field_2;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json<const_double_&,_double,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)this_03,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)in_RDI);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)in_stack_fffffffffffffdf0);
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      other = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>(this,in_stack_fffffffffffffe38);
      this_01 = &local_188;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)in_stack_fffffffffffffe00,other);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)this_01);
      fileops::generateJsonString(other,SUB81((ulong)this_01 >> 0x38,0));
      SmallBuffer::SmallBuffer<std::__cxx11::string,void>(this_00,u);
      std::__cxx11::string::~string(this_01);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)this_01);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)this_01);
      in_RDI = this_03;
    }
  }
  return in_RDI;
}

Assistant:

SmallBuffer typeConvert(DataType type, const double* vals, size_t size)
{
    if ((vals == nullptr) || (size == 0)) {
        return emptyBlock(type, DataType::HELICS_VECTOR);
    }
    if (size == 1) {
        // treat like a single double
        return typeConvert(type, vals[0]);
    }
    switch (type) {
        case DataType::HELICS_DOUBLE:
            return ValueConverter<double>::convert(vectorNorm(vals, size));
        case DataType::HELICS_TIME:
            return ValueConverter<int64_t>::convert(Time(vectorNorm(vals, size)).getBaseTimeCode());
        case DataType::HELICS_INT:
            return ValueConverter<int64_t>::convert(static_cast<int64_t>(vectorNorm(vals, size)));
        case DataType::HELICS_COMPLEX: {
            const std::complex<double> cval(vals[0], vals[1]);
            return ValueConverter<std::complex<double>>::convert(cval);
        }
        case DataType::HELICS_BOOL:
            return ValueConverter<std::string_view>::convert((vectorNorm(vals, size) != 0.0) ? "1" :
                                                                                               "0");
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
            return ValueConverter<std::string_view>::convert(helicsVectorString(vals, size));
        case DataType::HELICS_NAMED_POINT:
            return ValueConverter<NamedPoint>::convert(
                NamedPoint{helicsVectorString(vals, size), std::nan("0")});
        case DataType::HELICS_COMPLEX_VECTOR: {
            std::vector<std::complex<double>> cvec;
            cvec.reserve(size);
            for (size_t ii = 0; ii < size; ++ii) {
                cvec.emplace_back(vals[ii], 0.0);
            }
            return ValueConverter<std::vector<std::complex<double>>>::convert(cvec);
        } break;
        case DataType::HELICS_VECTOR:
        default:
            return ValueConverter<double>::convert(vals, size);
        case DataType::HELICS_JSON: {
            nlohmann::json json;
            json["type"] = typeNameStringRef(DataType::HELICS_VECTOR);
            nlohmann::json jsonArray = nlohmann::json::array();
            for (size_t ii = 0; ii < size; ++ii) {
                jsonArray.push_back(vals[ii]);
            }
            json["value"] = std::move(jsonArray);
            return fileops::generateJsonString(json);
        }
    }
}